

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O0

void secp256k1_scratch_destroy(secp256k1_callback *error_callback,secp256k1_scratch *scratch)

{
  int iVar1;
  secp256k1_callback *in_RSI;
  char *in_stack_ffffffffffffffe8;
  
  if (in_RSI != (secp256k1_callback *)0x0) {
    iVar1 = secp256k1_memcmp_var(in_RSI,"scratch",8);
    if (iVar1 == 0) {
      if (in_RSI[1].fn != (_func_void_char_ptr_void_ptr *)0x0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/scratch_impl.h"
                ,0x20,"test condition failed: scratch->alloc_size == 0");
        abort();
      }
      memset(in_RSI,0,8);
      free(in_RSI);
    }
    else {
      secp256k1_callback_call(in_RSI,in_stack_ffffffffffffffe8);
    }
  }
  return;
}

Assistant:

static void secp256k1_scratch_destroy(const secp256k1_callback* error_callback, secp256k1_scratch* scratch) {
    if (scratch != NULL) {
        if (secp256k1_memcmp_var(scratch->magic, "scratch", 8) != 0) {
            secp256k1_callback_call(error_callback, "invalid scratch space");
            return;
        }
        VERIFY_CHECK(scratch->alloc_size == 0); /* all checkpoints should be applied */
        memset(scratch->magic, 0, sizeof(scratch->magic));
        free(scratch);
    }
}